

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::ENUMS::GetEnumAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ENUMS *this,EnumDescriptor *pArray,KUINT32 NumElements,
          KINT32 Value)

{
  ostream *poVar1;
  int local_1b4;
  int local_1b0;
  KINT32 i32Middle;
  KINT32 i32Upper;
  KINT32 i32Lower;
  KStringStream ss;
  ostream local_198 [376];
  KUINT32 local_20;
  int local_1c;
  KINT32 Value_local;
  KUINT32 NumElements_local;
  EnumDescriptor *pArray_local;
  
  local_1c = (int)pArray;
  local_20 = NumElements;
  _Value_local = this;
  pArray_local = (EnumDescriptor *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i32Upper);
  i32Middle = 0;
  local_1b0 = local_1c + -1;
  local_1b4 = local_1b0;
  while (local_1b4 = local_1b4 / 2,
        *(KUINT32 *)(_Value_local + (long)local_1b4 * 0x10) != local_20 && i32Middle <= local_1b0) {
    if ((int)local_20 < *(int *)(_Value_local + (long)local_1b4 * 0x10)) {
      local_1b0 = local_1b4 + -1;
    }
    else {
      i32Middle = local_1b4 + 1;
    }
    local_1b4 = i32Middle + local_1b0;
  }
  if (local_1b0 < i32Middle) {
    poVar1 = std::operator<<(local_198,"Unknown Enum: ");
    std::ostream::operator<<(poVar1,local_20);
    std::__cxx11::stringstream::str();
  }
  else {
    poVar1 = std::operator<<(local_198,*(char **)(_Value_local + (long)local_1b4 * 0x10 + 8));
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::operator<<(poVar1,")");
    std::__cxx11::stringstream::str();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&i32Upper);
  return __return_storage_ptr__;
}

Assistant:

KString KDIS::DATA_TYPE::ENUMS::GetEnumAsString( const EnumDescriptor * pArray, KUINT32 NumElements, KINT32 Value )
{
    KStringStream ss;
    KINT32 i32Lower = 0, i32Upper = NumElements - 1, i32Middle = ( i32Lower + i32Upper ) / 2;

    while( pArray[i32Middle].Value != Value && i32Lower <= i32Upper )
    {
        if( pArray[i32Middle].Value > Value )
        {
            // Search the left side.
            i32Upper = i32Middle - 1;
        }
        else
        {
            // Search the right side.
            i32Lower = i32Middle + 1;
        }

        i32Middle = ( i32Lower + i32Upper ) / 2;
    }

    if( i32Lower <= i32Upper )
    {
        ss << pArray[i32Middle].Name << "(" << Value << ")";
        return ss.str();
    }

    ss << "Unknown Enum: " << Value;
    return ss.str();
}